

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::PixelUnpackBufferStorageTestCase::execute
          (PixelUnpackBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ulong uVar1;
  ostringstream *this_00;
  byte bVar2;
  GLenum GVar3;
  ulong uVar4;
  uint uVar5;
  uchar *puVar6;
  bool bVar7;
  ulong uVar8;
  uint uVar9;
  PixelUnpackBufferStorageTestCase *pPVar10;
  uint uVar11;
  ulong uVar12;
  uchar uVar13;
  uchar *puVar14;
  uchar local_1e1;
  PixelUnpackBufferStorageTestCase *local_1e0;
  byte local_1d1;
  ulong local_1d0;
  ulong local_1c8;
  uint local_1bc;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  (*this->m_gl->bindBuffer)(0x88ec,this->m_sparse_bo);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd93);
  (*this->m_gl->bindTexture)(0xde1,this->m_to);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd96);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  local_1e0 = this;
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd99);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1d0 = 0;
  local_1d1 = true;
  do {
    if ((int)local_1d0 != 2) {
      if ((int)local_1d0 == 1) {
        uVar11 = local_1e0->m_page_size;
        uVar9 = local_1e0->m_texture_data_size;
        if (uVar11 <= uVar9) {
          uVar5 = 0;
          do {
            pPVar10 = local_1e0;
            (*local_1e0->m_gl->bufferPageCommitmentARB)
                      (0x88ec,(ulong)(local_1e0->m_page_size * uVar5),(long)local_1e0->m_page_size,
                       ~(byte)uVar5 & 1);
            GVar3 = (*pPVar10->m_gl->getError)();
            glu::checkError(GVar3,"glBufferPageCommitmentARB() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                            ,0xdc0);
            pPVar10 = local_1e0;
            if ((uVar5 & 1) == 0) {
              uVar4 = (ulong)(local_1e0->m_page_size * uVar5);
              (*local_1e0->m_gl->copyBufferSubData)
                        (0x8f36,0x88ec,uVar4,uVar4,(long)local_1e0->m_page_size);
              GVar3 = (*pPVar10->m_gl->getError)();
              glu::checkError(GVar3,"glCopyBufferSubData() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                              ,0xdc8);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < uVar9 / uVar11);
        }
      }
      else {
        (*local_1e0->m_gl->bufferPageCommitmentARB)
                  (0x88ec,0,(ulong)local_1e0->m_sparse_bo_size_rounded,'\x01');
        GVar3 = (*local_1e0->m_gl->getError)();
        glu::checkError(GVar3,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0xdac);
        (*local_1e0->m_gl->copyBufferSubData)
                  (0x8f36,0x88ec,0,0,(ulong)local_1e0->m_texture_data_size);
        GVar3 = (*local_1e0->m_gl->getError)();
        glu::checkError(GVar3,"glCopyBufferSubData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0xdb1);
      }
    }
    (*local_1e0->m_gl->texSubImage2D)
              (0xde1,0,0,0,local_1e0->m_to_width,local_1e0->m_to_height,0x1908,0x1401,
               local_1e0->m_to_data_zero);
    GVar3 = (*local_1e0->m_gl->getError)();
    glu::checkError(GVar3,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xde2);
    (*local_1e0->m_gl->texSubImage2D)
              (0xde1,0,0,0,local_1e0->m_to_width,local_1e0->m_to_height,0x1908,0x1401,(void *)0x0);
    GVar3 = (*local_1e0->m_gl->getError)();
    glu::checkError(GVar3,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xde9);
    memset(local_1e0->m_read_data_ptr,0xff,(ulong)local_1e0->m_texture_data_size);
    (*local_1e0->m_gl->getTexImage)(0xde1,0,0x1908,0x1401,local_1e0->m_read_data_ptr);
    GVar3 = (*local_1e0->m_gl->getError)();
    glu::checkError(GVar3,"glGetTexImage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xdf0);
    pPVar10 = local_1e0;
    if (local_1e0->m_to_height == 0) {
      bVar7 = true;
    }
    else {
      puVar6 = local_1e0->m_read_data_ptr;
      puVar14 = local_1e0->m_texture_data_ptr;
      bVar7 = true;
      local_1c8 = 0;
      uVar11 = 0;
      uVar4 = local_1d0;
      do {
        if ((pPVar10->m_to_width != 0) && (bVar7)) {
          uVar12 = 0;
          do {
            if (bVar7 != false) {
              local_1b8 = (ulong)uVar11;
              uVar8 = 0;
              local_1bc = uVar11;
              do {
                if ((int)uVar4 == 2) {
                  bVar2 = 0;
                }
                else {
                  bVar2 = 1;
                  if ((int)uVar4 == 1) {
                    bVar2 = (byte)((local_1b8 + uVar8 & 0xffffffff) /
                                  (ulong)(uint)pPVar10->m_page_size) ^ 1;
                  }
                }
                if ((bVar2 & 1) == 0) {
                  uVar13 = '\0';
LAB_00a55ae0:
                  if (puVar6[uVar8] != uVar13) {
LAB_00a55aea:
                    local_1b0._0_8_ = pPVar10->m_testCtx->m_log;
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"Invalid texel data (channel:",0x1c);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,") found at X:",0xd);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", Y:",4);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"). Expected value:",0x12);
                    local_1e1 = uVar13;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,(char *)&local_1e1,1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,", found value:",0xe);
                    local_1e1 = puVar14[uVar8];
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,(char *)&local_1e1,1);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream(this_00);
                    std::ios_base::~ios_base(local_138);
                    bVar7 = false;
                    pPVar10 = local_1e0;
                    uVar4 = local_1d0;
                  }
                }
                else {
                  uVar13 = puVar14[uVar8];
                  uVar9 = (int)(char)uVar13 - (int)(char)puVar6[uVar8];
                  uVar11 = -uVar9;
                  if (0 < (int)uVar9) {
                    uVar11 = uVar9;
                  }
                  if ((uVar11 & 0xff) != 0) goto LAB_00a55aea;
                  if ((bVar2 & 1) == 0) goto LAB_00a55ae0;
                }
                uVar1 = uVar8 + 1;
              } while ((uVar8 < 3) && (uVar8 = uVar1, bVar7 != false));
              puVar14 = puVar14 + uVar1;
              puVar6 = puVar6 + uVar1;
              uVar11 = local_1bc + (int)uVar1;
            }
            uVar12 = uVar12 + 1;
          } while ((uVar12 < pPVar10->m_to_width) && (bVar7 != false));
        }
        local_1c8 = local_1c8 + 1;
      } while ((local_1c8 < pPVar10->m_to_height) && (bVar7 != false));
    }
    bVar7 = (bool)(local_1d1 & bVar7);
    (*pPVar10->m_gl->bufferPageCommitmentARB)
              (0x88ec,0,(ulong)pPVar10->m_sparse_bo_size_rounded,'\0');
    GVar3 = (*pPVar10->m_gl->getError)();
    glu::checkError(GVar3,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xe2b);
    uVar11 = (int)local_1d0 + 1;
    local_1d0 = (ulong)uVar11;
    local_1d1 = bVar7;
    if (uVar11 == 3) {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool PixelUnpackBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bindTexture(GL_TEXTURE_2D, m_to);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	/* Run three separate iterations:
	 *
	 * a) All pages holding the source texture data are committed.
	 * b) Use a zig-zag memory page commitment layout patern.
	 * b) No pages are committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool result_local = true;

		/* Set up the memory page commitment & the storage contents*/
		switch (n_iteration)
		{
		case 0:
		{
			m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, 0,			 /* offset */
										 m_sparse_bo_size_rounded, GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_PIXEL_UNPACK_BUFFER, 0, /* readOffset */
								   0,											   /* writeOffset */
								   m_texture_data_size);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			break;
		}

		case 1:
		{
			const unsigned int n_pages = m_texture_data_size / m_page_size;

			for (unsigned int n_page = 0; n_page < n_pages; ++n_page)
			{
				const bool should_commit = ((n_page % 2) == 0);

				m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, m_page_size * n_page, m_page_size,
											 should_commit ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

				if (should_commit)
				{
					m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_PIXEL_UNPACK_BUFFER,
										   m_page_size * n_page, /* readOffset */
										   m_page_size * n_page, /* writeOffset */
										   m_page_size);
					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");
				}
			} /* for (all relevant memory pages) */

			break;
		}

		case 2:
		{
			/* Do nothing */
			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		/* Clean up the base mip-map's contents before we proceeding with updating it
		 * with data downloaded from the BO, in order to avoid situation where silently
		 * failing glTexSubImage2D() calls slip past unnoticed */
		m_gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
						   0,				 /* xoffset */
						   0,				 /* yoffset */
						   m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, m_to_data_zero);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexSubImage2D() call failed.");

		/* Update the base mip-map's contents */
		m_gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
						   0,				 /* xoffset */
						   0,				 /* yoffset */
						   m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, (const glw::GLvoid*)0);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexSubImage2D() call failed.");

		/* Read back the stored mip-map data */
		memset(m_read_data_ptr, 0xFF, m_texture_data_size);

		m_gl.getTexImage(GL_TEXTURE_2D, 0, /* level */
						 GL_RGBA, GL_UNSIGNED_BYTE, m_read_data_ptr);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetTexImage() call failed.");

		/* Verify the data */
		unsigned int n_current_tex_data_byte	= 0;
		const char*  read_data_traveller_ptr	= (const char*)m_read_data_ptr;
		const char*  texture_data_traveller_ptr = (const char*)m_texture_data_ptr;

		for (unsigned int y = 0; y < m_to_height && result_local; ++y)
		{
			for (unsigned int x = 0; x < m_to_width && result_local; ++x)
			{
				for (unsigned int n_component = 0; n_component < 4 /* rgba */ && result_local; ++n_component)
				{
					char expected_value			= 0;
					bool is_from_committed_page = true;

					if (n_iteration == 1) /* zig-zag */
					{
						is_from_committed_page = ((n_current_tex_data_byte / m_page_size) % 2) == 0;
					}
					else if (n_iteration == 2) /* no pages committed */
					{
						is_from_committed_page = false;
					}

					if (is_from_committed_page)
					{
						expected_value = *texture_data_traveller_ptr;
					}

					if ((is_from_committed_page && de::abs(expected_value - *read_data_traveller_ptr) >= 1) ||
						(!is_from_committed_page && *read_data_traveller_ptr != expected_value))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel data (channel:" << n_component
										   << ")"
											  " found at X:"
										   << x << ", "
												   "Y:"
										   << y << ")."
												   " Expected value:"
										   << expected_value << ","
																" found value:"
										   << *texture_data_traveller_ptr << tcu::TestLog::EndMessage;

						result_local = false;
					}

					n_current_tex_data_byte++;
					read_data_traveller_ptr++;
					texture_data_traveller_ptr++;
				} /* for (all components) */
			}	 /* for (all columns) */
		}		  /* for (all rows) */

		result &= result_local;

		/* Clean up */
		m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, 0,			  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (three iterations) */

	return result;
}